

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-delayed-accept.c
# Opt level: O3

void client_connect(void)

{
  uv_stream_t *server;
  int iVar1;
  int iVar2;
  uv_loop_t *puVar3;
  uv_timer_t *req;
  uv_loop_t *puVar4;
  uv_timer_t *handle;
  uv_loop_t *loop;
  uv_tcp_t *tcp;
  void *pvVar5;
  undefined8 *extraout_RDX;
  undefined8 *__size;
  uv_handle_t *handle_00;
  long *__ptr;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in addr;
  undefined8 uStack_a8;
  long lStack_a0;
  uv_handle_t *puStack_98;
  code *pcStack_90;
  undefined8 uStack_88;
  long lStack_80;
  uv_loop_t *puStack_78;
  uv_timer_t *puStack_70;
  undefined1 auStack_50 [16];
  undefined8 uStack_40;
  uv__queue *local_30;
  undefined1 local_28 [24];
  
  uStack_40._0_4_ = 0x1815a7;
  uStack_40._4_4_ = 0;
  puVar3 = (uv_loop_t *)malloc(0xd8);
  uStack_40._0_4_ = 0x1815b4;
  uStack_40._4_4_ = 0;
  req = (uv_timer_t *)malloc(0x68);
  uStack_40._0_4_ = 0x1815cd;
  uStack_40._4_4_ = 0;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)(local_28 + 8));
  local_28._0_8_ = SEXT48(iVar1);
  local_30 = (uv__queue *)0x0;
  if ((uv__queue *)local_28._0_8_ == (uv__queue *)0x0) {
    if (puVar3 == (uv_loop_t *)0x0) goto LAB_00181669;
    if (req == (uv_timer_t *)0x0) goto LAB_0018166e;
    uStack_40._0_4_ = 0x1815f8;
    uStack_40._4_4_ = 0;
    puVar4 = uv_default_loop();
    uStack_40._0_4_ = 0x181603;
    uStack_40._4_4_ = 0;
    iVar1 = uv_tcp_init(puVar4,(uv_tcp_t *)puVar3);
    local_28._0_8_ = SEXT48(iVar1);
    local_30 = (uv__queue *)0x0;
    if ((uv__queue *)local_28._0_8_ != (uv__queue *)0x0) goto LAB_00181673;
    uStack_40._0_4_ = 0x181636;
    uStack_40._4_4_ = 0;
    iVar1 = uv_tcp_connect((uv_connect_t *)req,(uv_tcp_t *)puVar3,(sockaddr *)(local_28 + 8),
                           connect_cb);
    local_28._0_8_ = SEXT48(iVar1);
    local_30 = (uv__queue *)0x0;
    if ((uv__queue *)local_28._0_8_ == (uv__queue *)0x0) {
      return;
    }
  }
  else {
    uStack_40._0_4_ = 0x181669;
    uStack_40._4_4_ = 0;
    client_connect_cold_1();
LAB_00181669:
    uStack_40._0_4_ = 0x18166e;
    uStack_40._4_4_ = 0;
    client_connect_cold_5();
LAB_0018166e:
    uStack_40._0_4_ = 0x181673;
    uStack_40._4_4_ = 0;
    client_connect_cold_4();
LAB_00181673:
    uStack_40._0_4_ = 0x181682;
    uStack_40._4_4_ = 0;
    client_connect_cold_2();
  }
  puVar4 = (uv_loop_t *)local_28;
  iVar1 = (int)&local_30;
  uStack_40 = connection_cb;
  client_connect_cold_3();
  auStack_50._0_8_ = SEXT48(iVar1);
  auStack_50._8_8_ = puVar3;
  uStack_40 = (code *)req;
  if ((void *)auStack_50._0_8_ == (void *)0x0) {
    handle = (uv_timer_t *)malloc(0x78);
    puVar3 = puVar4;
    if (handle == (uv_timer_t *)0x0) goto LAB_00181750;
    loop = uv_default_loop();
    iVar1 = uv_timer_init(loop,handle);
    auStack_50._0_8_ = SEXT48(iVar1);
    req = handle;
    if ((void *)auStack_50._0_8_ != (void *)0x0) goto LAB_00181755;
    handle->data = puVar4;
    iVar1 = uv_timer_start(handle,do_accept,1000,0);
    auStack_50._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_50._0_8_ == (void *)0x0) {
      connection_cb_called = connection_cb_called + 1;
      return;
    }
  }
  else {
    connection_cb_cold_1();
LAB_00181750:
    connection_cb_cold_4();
LAB_00181755:
    connection_cb_cold_2();
  }
  handle_00 = (uv_handle_t *)auStack_50;
  connection_cb_cold_3();
  iVar1 = (int)&uStack_88;
  pcStack_90 = (code *)0x181789;
  puStack_78 = puVar3;
  puStack_70 = req;
  tcp = (uv_tcp_t *)malloc(0xd8);
  if (handle_00 == (uv_handle_t *)0x0) {
    pcStack_90 = (code *)0x18183a;
    do_accept_cold_4();
LAB_0018183a:
    pcStack_90 = (code *)0x18183f;
    do_accept_cold_3();
LAB_0018183f:
    pcStack_90 = (code *)0x18184c;
    do_accept_cold_1();
  }
  else {
    if (tcp == (uv_tcp_t *)0x0) goto LAB_0018183a;
    pcStack_90 = (code *)0x1817a3;
    puVar3 = uv_default_loop();
    pcStack_90 = (code *)0x1817ae;
    iVar2 = uv_tcp_init(puVar3,tcp);
    lStack_80 = (long)iVar2;
    uStack_88 = 0;
    if (lStack_80 != 0) goto LAB_0018183f;
    server = (uv_stream_t *)handle_00->data;
    pcStack_90 = (code *)0x1817d6;
    iVar2 = uv_accept(server,(uv_stream_t *)tcp);
    lStack_80 = (long)iVar2;
    uStack_88 = 0;
    if (lStack_80 == 0) {
      do_accept_called = do_accept_called + 1;
      pcStack_90 = (code *)0x181805;
      uv_close((uv_handle_t *)tcp,close_cb);
      if (do_accept_called == 2) {
        pcStack_90 = (code *)0x18181d;
        uv_close((uv_handle_t *)server,close_cb);
      }
      uv_close(handle_00,close_cb);
      return;
    }
  }
  __ptr = &lStack_80;
  pcStack_90 = close_cb;
  do_accept_cold_2();
  if (__ptr != (long *)0x0) {
    puStack_98 = (uv_handle_t *)0x181864;
    free(__ptr);
    close_cb_called = close_cb_called + 1;
    return;
  }
  puStack_98 = (uv_handle_t *)connect_cb;
  close_cb_cold_1();
  __size = &uStack_a8;
  puStack_98 = handle_00;
  if (__ptr == (long *)0x0) {
    connect_cb_cold_3();
  }
  else {
    lStack_a0 = (long)iVar1;
    uStack_a8 = 0;
    if (lStack_a0 == 0) {
      iVar1 = uv_read_start((uv_stream_t *)__ptr[10],alloc_cb,read_cb);
      lStack_a0 = (long)iVar1;
      uStack_a8 = 0;
      if (lStack_a0 == 0) {
        connect_cb_called = connect_cb_called + 1;
        free(__ptr);
        return;
      }
      goto LAB_001818ef;
    }
  }
  connect_cb_cold_1();
LAB_001818ef:
  connect_cb_cold_2();
  pvVar5 = malloc((size_t)__size);
  *extraout_RDX = pvVar5;
  extraout_RDX[1] = __size;
  return;
}

Assistant:

static void client_connect(void) {
  struct sockaddr_in addr;
  uv_tcp_t* client = (uv_tcp_t*)malloc(sizeof *client);
  uv_connect_t* connect_req = malloc(sizeof *connect_req);
  int r;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  ASSERT_NOT_NULL(client);
  ASSERT_NOT_NULL(connect_req);

  r = uv_tcp_init(uv_default_loop(), client);
  ASSERT_OK(r);

  r = uv_tcp_connect(connect_req,
                     client,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT_OK(r);
}